

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O3

uint32_t chck_utf8_codepoint(char *u8)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  if (u8 == (char *)0x0) {
    __assert_fail("u8",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/unicode/unicode.c"
                  ,0x87,"uint32_t chck_utf8_codepoint(const char *)");
  }
  uVar2 = (uint)*u8;
  lVar3 = 0;
  do {
    if (((&DAT_001023d0)[lVar3] & *u8) == (&DAT_001023d1)[lVar3]) {
      if ((ulong)(byte)(&UNK_001023d2)[lVar3] == 0) {
        return 0xfffd;
      }
      uVar4 = 0;
      uVar5 = 0;
      while( true ) {
        bVar1 = u8[uVar4];
        if (uVar5 == 0) {
          uVar2 = 0xffU >> (""[bVar1] & 0x1f) & (uint)bVar1;
        }
        else {
          uVar2 = uVar2 << 6 | bVar1 & 0x3f;
        }
        uVar5 = (uint)""[(ulong)""[bVar1] + (ulong)(uVar5 << 4) + 0x100];
        if (uVar5 == 1) break;
        uVar4 = uVar4 + 1;
        if ((byte)(&UNK_001023d2)[lVar3] == uVar4) {
          return uVar2;
        }
      }
      return 0xfffd;
    }
    lVar3 = lVar3 + 3;
  } while (lVar3 != 0xf);
  return 0xfffd;
}

Assistant:

uint32_t
chck_utf8_codepoint(const char u8[4])
{
   assert(u8);

   const uint8_t mb = chck_utf8_mblen(u8);
   uint32_t state = CHCK_UTF8_ACCEPT, cp = u8[0];
   for (uint8_t i = 0; i < mb; ++i) {
      if (chck_utf8_decode(&state, &cp, u8[i]) == CHCK_UTF8_REJECT)
         return CHCK_REPLACEMENT_CHAR;
   }

   return (mb > 0 ? cp : CHCK_REPLACEMENT_CHAR);
}